

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lines.hpp
# Opt level: O3

type just::lines::
     split<false,std::__cxx11::string,std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_,
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *out_)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin_;
  iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_98;
  iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_58;
  
  begin_._M_current = (s_->_M_dataplus)._M_p;
  iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ::iterator(&local_58,begin_,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(begin_._M_current + s_->_M_string_length));
  paVar1 = &local_98._current.field_2;
  local_98._at._M_current = (char *)0x0;
  local_98._end._M_current = (char *)0x0;
  local_98._at_end = true;
  local_98._current._M_string_length = 0;
  local_98._current.field_2._M_local_buf[0] = '\0';
  local_98._current._M_dataplus._M_p = (pointer)paVar1;
  std::
  copy<just::lines::iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,false>,std::back_insert_iterator<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_58,&local_98,
             (back_insert_iterator<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )out_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._current._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._current._M_dataplus._M_p,
                    CONCAT71(local_98._current.field_2._M_allocated_capacity._1_7_,
                             local_98._current.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._current._M_dataplus._M_p != &local_58._current.field_2) {
    operator_delete(local_58._current._M_dataplus._M_p,
                    local_58._current.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

typename impl::ignore_second<void, typename String::const_iterator>::type
    split(const String& s_, Container& out_)
    {
      std::copy(
        begin_lines<KeepNewlines>(s_),
        end_lines<KeepNewlines>(s_),
        std::back_inserter(out_)
      );
    }